

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

void __thiscall wasm::DAEFunctionInfo::clear(DAEFunctionInfo *this)

{
  DAEFunctionInfo local_118;
  DAEFunctionInfo *local_10;
  DAEFunctionInfo *this_local;
  
  local_10 = this;
  memset(&local_118,0,0x108);
  DAEFunctionInfo(&local_118);
  operator=(this,&local_118);
  ~DAEFunctionInfo(&local_118);
  return;
}

Assistant:

void clear() { *this = DAEFunctionInfo(); }